

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O0

void getaddrinfo_cuncurrent_cb(uv_getaddrinfo_t *handle,int status,addrinfo *res)

{
  int *__ptr;
  int *data;
  int i;
  addrinfo *res_local;
  int status_local;
  uv_getaddrinfo_t *handle_local;
  
  __ptr = (int *)handle->data;
  data._4_4_ = 0;
  do {
    if (9 < data._4_4_) {
LAB_00135f26:
      if (9 < data._4_4_) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
                ,0x4a,"i < CONCURRENT_COUNT");
        abort();
      }
      free(__ptr);
      uv_freeaddrinfo(res);
      getaddrinfo_cbs = getaddrinfo_cbs + 1;
      return;
    }
    if (getaddrinfo_handles + data._4_4_ == handle) {
      if (data._4_4_ != *__ptr) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
                ,0x44,"i == *data");
        abort();
      }
      callback_counts[data._4_4_] = callback_counts[data._4_4_] + 1;
      goto LAB_00135f26;
    }
    data._4_4_ = data._4_4_ + 1;
  } while( true );
}

Assistant:

static void getaddrinfo_cuncurrent_cb(uv_getaddrinfo_t* handle,
                                      int status,
                                      struct addrinfo* res) {
  int i;
  int* data = (int*)handle->data;

  for (i = 0; i < CONCURRENT_COUNT; i++) {
    if (&getaddrinfo_handles[i] == handle) {
      ASSERT(i == *data);

      callback_counts[i]++;
      break;
    }
  }
  ASSERT (i < CONCURRENT_COUNT);

  free(data);
  uv_freeaddrinfo(res);

  getaddrinfo_cbs++;
}